

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLNodePrivate::AddEmptyDefaultProperty(ON_XMLNodePrivate *this)

{
  ON_XMLProperty local_170;
  ON_XMLVariant local_108;
  
  ::ON_XMLVariant::ON_XMLVariant(&local_108,L"");
  ON_XMLProperty::ON_XMLProperty(&local_170,&local_108);
  AddProperty(this,&local_170,false);
  ON_XMLProperty::~ON_XMLProperty(&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return;
}

Assistant:

void ON_XMLNodePrivate::AddEmptyDefaultProperty(void)
{
  AddProperty(ON_XMLProperty(L""));
}